

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_cb_close(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int status_local;
  int events_local;
  char *filename_local;
  uv_fs_event_t *handle_local;
  
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x18a,"status","==","0",(long)status,"==",0);
    abort();
  }
  if (2 < (long)fs_event_cb_called) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x18c,"fs_event_cb_called","<","3",(long)fs_event_cb_called,"<",3);
    abort();
  }
  fs_event_cb_called = fs_event_cb_called + 1;
  if (fs_event_cb_called == 3) {
    uv_close(handle,close_cb);
  }
  return;
}

Assistant:

static void fs_event_cb_close(uv_fs_event_t* handle,
                              const char* filename,
                              int events,
                              int status) {
  ASSERT_OK(status);

  ASSERT_LT(fs_event_cb_called, 3);
  ++fs_event_cb_called;

  if (fs_event_cb_called == 3) {
    uv_close((uv_handle_t*) handle, close_cb);
  }
}